

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

void __thiscall
mp::LinTerms::
fold_into<gch::small_vector<std::pair<int,double>,256u,std::allocator<std::pair<int,double>>>>
          (LinTerms *this,
          small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_> *vec)

{
  LinTerms *pLVar1;
  value_type *in_RSI;
  size_t i;
  size_type in_stack_ffffffffffffffa8;
  value_type *value;
  small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_ffffffffffffffb0;
  LinTerms *this_00;
  double local_38;
  int local_2c;
  pair<int,_double> local_28;
  LinTerms *local_18;
  value_type *local_10;
  
  local_10 = in_RSI;
  size((LinTerms *)0x511a37);
  gch::small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_>::resize
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_18 = (LinTerms *)0x0;
  while( true ) {
    this_00 = local_18;
    pLVar1 = (LinTerms *)size((LinTerms *)0x511a61);
    if (pLVar1 <= this_00) break;
    value = local_10;
    local_2c = var(this_00,(size_t)local_10);
    local_38 = coef(this_00,(size_t)value);
    std::pair<int,_double>::pair<int,_double,_true>(&local_28,&local_2c,&local_38);
    gch::small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_>::
    push_back((small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_>
               *)this_00,value);
    local_18 = (LinTerms *)
               ((long)&(local_18->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data
                       .super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr + 1);
  }
  return;
}

Assistant:

void LinTerms::fold_into(Vec& vec) {
  vec.resize(size());
  for (size_t i=0; i<size(); ++i)
    vec.push_back({ var(i), coef(i) });
}